

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

pair<helics::route_id,_helics::ActionMessage> * __thiscall
helics::CommonCore::getHandleInfo(CommonCore *this,InterfaceHandle handle)

{
  type ppVar1;
  anon_class_4_1_58265f66 *in_stack_00000018;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_00000020;
  
  ppVar1 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
           read<helics::CommonCore::getHandleInfo(helics::InterfaceHandle)const::__0>
                     (in_stack_00000020,in_stack_00000018);
  return ppVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getHandleInfo(InterfaceHandle handle) const
{
    return handles.read([handle](auto& hand) { return hand.getHandleInfo(handle.baseValue()); });
}